

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

int CVmRun::apply_index(vm_val_t *result,vm_val_t *container_val,vm_val_t *index_val)

{
  vm_datatype_t vVar1;
  uint uVar2;
  int iVar3;
  char *lst;
  
  vVar1 = container_val->typ;
  if (vVar1 != VM_OBJ) {
    if (vVar1 == VM_LIST) {
      lst = get_const_ptr((container_val->val).ofs);
      CVmObjList::index_list(result,lst,index_val);
    }
    return (uint)(vVar1 == VM_LIST);
  }
  uVar2 = (container_val->val).obj;
  iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 0x138))
                    (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),result,uVar2,index_val);
  return iVar3;
}

Assistant:

int CVmRun::apply_index(VMG_ vm_val_t *result,
                        const vm_val_t *container_val,
                        const vm_val_t *index_val)
{
    /* check the type of the value we're indexing */
    switch(container_val->typ)
    {
    case VM_LIST:
        /* list constant - use the static list indexing method */
        CVmObjList::index_list(
            vmg_ result, get_const_ptr(vmg_ container_val->val.ofs),
            index_val);
        return TRUE;

    case VM_OBJ:
        /* object - use the object's virtual indexing method */
        {
            vm_obj_id_t obj = container_val->val.obj;
            return vm_objp(vmg_ obj)->index_val_q(vmg_ result, obj, index_val);
        }

    default:
        /* other values cannot be indexed */
        return FALSE;
    }
}